

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
adios2sys::CommandLineArguments::DeleteRemainingArguments
          (CommandLineArguments *this,int argc,char ***argv)

{
  void *pvVar1;
  long *in_RDX;
  int in_ESI;
  int cc;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
    pvVar1 = *(void **)(*in_RDX + (long)local_1c * 8);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
  }
  if ((void *)*in_RDX != (void *)0x0) {
    operator_delete__((void *)*in_RDX);
  }
  return;
}

Assistant:

void CommandLineArguments::DeleteRemainingArguments(int argc, char*** argv)
{
  int cc;
  for (cc = 0; cc < argc; ++cc) {
    delete[] (*argv)[cc];
  }
  delete[] * argv;
}